

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBezierCurves(XMLLoader *this,Ref<embree::XML> *xml,CurveSubtype subtype)

{
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *this_00;
  string *psVar1;
  XML *pXVar2;
  bool bVar3;
  uint uVar4;
  size_t i;
  HairSetNode *this_01;
  int in_ECX;
  HairSetNode *siglen;
  undefined4 in_register_00000014;
  undefined8 *puVar5;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  uchar *in_R8;
  size_t in_R9;
  ulong uVar6;
  string tessellation_rate;
  allocator local_b1;
  string local_b0;
  undefined8 *local_90;
  undefined1 local_88 [16];
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> indices;
  undefined1 local_60 [40];
  Ref<embree::SceneGraph::MaterialNode> material;
  
  puVar5 = (undefined8 *)CONCAT44(in_register_00000014,subtype);
  psVar1 = (string *)*puVar5;
  local_60._32_8_ = this;
  std::__cxx11::string::string((string *)&tessellation_rate,"material",(allocator *)&indices);
  XML::child((XML *)&local_b0,psVar1);
  loadMaterial((XMLLoader *)&material,xml);
  if ((_func_int **)local_b0._M_dataplus._M_p != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_b0._M_dataplus._M_p + 0x18))();
  }
  std::__cxx11::string::~string((string *)&tessellation_rate);
  this_01 = (HairSetNode *)::operator_new(0x118);
  local_60._24_8_ = material.ptr;
  local_88._8_8_ = material.ptr;
  local_90 = puVar5;
  if (material.ptr != (MaterialNode *)0x0) {
    (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(material.ptr);
  }
  SceneGraph::HairSetNode::HairSetNode
            (this_01,RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE - (in_ECX == 0),
             (Ref<embree::SceneGraph::MaterialNode> *)(local_60 + 0x18),(BBox1f)0x3f80000000000000,0
            );
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  if ((_Base_ptr)local_60._24_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_60._24_8_ + 0x18))();
  }
  psVar1 = (string *)*local_90;
  std::__cxx11::string::string
            ((string *)&tessellation_rate,"animated_positions",(allocator *)&local_b0);
  XML::childOpt((XML *)&indices,psVar1);
  std::__cxx11::string::~string((string *)&tessellation_rate);
  this_00 = &this_01->positions;
  if (indices.super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    psVar1 = (string *)*local_90;
    std::__cxx11::string::string((string *)&local_b0,"positions",(allocator *)local_88);
    XML::childOpt((XML *)local_60,psVar1);
    loadVec3ffArray((avector<Vec3ff> *)&tessellation_rate,(XMLLoader *)xml,
                    (Ref<embree::XML> *)local_60);
    std::
    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                *)this_00,
               (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
               &tessellation_rate);
    alignedFree((void *)tessellation_rate.field_2._8_8_);
    tessellation_rate.field_2._8_8_ = 0;
    tessellation_rate._M_string_length = 0;
    tessellation_rate.field_2._M_allocated_capacity = 0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(*(_func_int ***)local_60._0_8_)[3])();
    }
    std::__cxx11::string::~string((string *)&local_b0);
    pXVar2 = (XML *)*local_90;
    std::__cxx11::string::string((string *)&tessellation_rate,"positions2",(allocator *)&local_b0);
    bVar3 = XML::hasChild(pXVar2,&tessellation_rate);
    std::__cxx11::string::~string((string *)&tessellation_rate);
    if (bVar3) {
      psVar1 = (string *)*local_90;
      std::__cxx11::string::string((string *)&local_b0,"positions2",(allocator *)local_88);
      XML::childOpt((XML *)local_60,psVar1);
      loadVec3ffArray((avector<Vec3ff> *)&tessellation_rate,(XMLLoader *)xml,
                      (Ref<embree::XML> *)local_60);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)this_00,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &tessellation_rate);
      alignedFree((void *)tessellation_rate.field_2._8_8_);
      tessellation_rate.field_2._8_8_ = 0;
      tessellation_rate._M_string_length = 0;
      tessellation_rate.field_2._M_allocated_capacity = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(*(_func_int ***)local_60._0_8_)[3])();
      }
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  else {
    for (uVar6 = 0;
        uVar6 < (ulong)((long)indices.
                              super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[0x11].field_0 -
                        (long)indices.
                              super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[0x10].field_0 >> 3);
        uVar6 = uVar6 + 1) {
      XML::child((XML *)&local_b0,
                 (size_t)indices.
                         super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      loadVec3ffArray((avector<Vec3ff> *)&tessellation_rate,(XMLLoader *)xml,
                      (Ref<embree::XML> *)&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)this_00,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &tessellation_rate);
      alignedFree((void *)tessellation_rate.field_2._8_8_);
      tessellation_rate.field_2._8_8_ = 0;
      tessellation_rate._M_string_length = 0;
      tessellation_rate.field_2._M_allocated_capacity = 0;
      if ((_func_int **)local_b0._M_dataplus._M_p != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_b0._M_dataplus._M_p + 0x18))();
      }
    }
  }
  if (indices.super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)((long)(indices.
                        super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->field_0 + 0x18))();
  }
  puVar5 = local_90;
  psVar1 = (string *)*local_90;
  std::__cxx11::string::string((string *)&tessellation_rate,"indices",(allocator *)local_60);
  XML::childOpt((XML *)&local_b0,psVar1);
  loadVec2iArray(&indices,(XMLLoader *)xml,(Ref<embree::XML> *)&local_b0);
  if ((_func_int **)local_b0._M_dataplus._M_p != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_b0._M_dataplus._M_p + 0x18))();
  }
  std::__cxx11::string::~string((string *)&tessellation_rate);
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize(&this_01->hairs,
           (long)indices.super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)indices.super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3);
  for (uVar6 = 0;
      uVar6 < (ulong)((long)indices.
                            super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)indices.
                            super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    (this_01->hairs).
    super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar6] =
         *(Hair *)(indices.
                   super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar6);
  }
  pXVar2 = (XML *)*puVar5;
  std::__cxx11::string::string((string *)&local_b0,"tessellation_rate",(allocator *)local_60);
  XML::parm(&tessellation_rate,pXVar2,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  bVar3 = std::operator!=(&tessellation_rate,"");
  siglen = (HairSetNode *)
           indices.super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (bVar3) {
    uVar4 = atoi(tessellation_rate._M_dataplus._M_p);
    this_01->tessellation_rate = uVar4;
    siglen = this_01;
  }
  psVar1 = (string *)*puVar5;
  std::__cxx11::string::string((string *)&local_b0,"flags",&local_b1);
  XML::childOpt((XML *)local_88,psVar1);
  loadUCharArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,(XMLLoader *)xml,
                 (Ref<embree::XML> *)local_88);
  ctx = (EVP_PKEY_CTX *)local_60;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&this_01->flags);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    (*((RefCount *)local_88._0_8_)->_vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_b0);
  SceneGraph::HairSetNode::verify(this_01,ctx,sig,(size_t)siglen,in_R8,in_R9);
  *(HairSetNode **)local_60._32_8_ = this_01;
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])();
  std::__cxx11::string::~string((string *)&tessellation_rate);
  std::_Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::~_Vector_base
            (&indices.super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])();
  if ((MaterialNode *)local_88._8_8_ != (MaterialNode *)0x0) {
    (**(code **)(*(long *)local_88._8_8_ + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)local_60._32_8_;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBezierCurves(const Ref<XML>& xml, SceneGraph::CurveSubtype subtype)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    RTCGeometryType type = (subtype == SceneGraph::ROUND_CURVE) ? RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE : RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions2")));
    }
    
    std::vector<Vec2i> indices = loadVec2iArray(xml->childOpt("indices"));
    mesh->hairs.resize(indices.size()); 
    for (size_t i=0; i<indices.size(); i++) 
      mesh->hairs[i] = SceneGraph::HairSetNode::Hair(indices[i].x,indices[i].y);

    std::string tessellation_rate = xml->parm("tessellation_rate");
    if (tessellation_rate != "")
      mesh->tessellation_rate = atoi(tessellation_rate.c_str());

    mesh->flags = loadUCharArray(xml->childOpt("flags"));

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }